

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t9(int pi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 in_EDI;
  char *script;
  uint32_t p [10];
  int id;
  int e;
  int c;
  int oc;
  int s;
  char *in_stack_ffffffffffffffa8;
  char *pcVar5;
  int pc;
  int iVar6;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint local_24;
  
  printf("Script store/run/status/stop/delete tests.\n");
  gpio_write(in_EDI,0x19,0);
  pcVar5 = "   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0";
  uVar1 = callback(in_EDI,0x19,0,t9cbf);
  uVar2 = store_script(in_EDI,pcVar5);
  do {
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(in_EDI,uVar2,&stack0xffffffffffffffb8);
  } while (iVar3 == 0);
  iVar3 = 99;
  iVar6 = 0x19;
  run_script(in_EDI,uVar2,2,&stack0xffffffffffffffb8);
  time_sleep(0x4000000000000000);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,iVar6,iVar3,(int)((ulong)pcVar5 >> 0x20)
        ,in_stack_ffffffffffffffa8);
  iVar3 = 200;
  iVar6 = 0x19;
  run_script(in_EDI,uVar2,2,&stack0xffffffffffffffb8);
  do {
    time_sleep(0x3fb999999999999a);
    iVar4 = script_status(in_EDI,uVar2,&stack0xffffffffffffffb8);
  } while (iVar4 == 2);
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,iVar6,iVar3,(int)((ulong)pcVar5 >> 0x20)
        ,in_stack_ffffffffffffffa8);
  iVar3 = 2000;
  iVar6 = 0x19;
  run_script(in_EDI,uVar2,2,&stack0xffffffffffffffb8);
  while( true ) {
    time_sleep(0x3fb999999999999a);
    iVar4 = script_status(in_EDI,uVar2,&stack0xffffffffffffffb8);
    pc = (int)((ulong)pcVar5 >> 0x20);
    if (iVar4 != 2) break;
    if (local_24 < 0x640) {
      stop_script(in_EDI,uVar2);
    }
  }
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,iVar6,iVar3,pc,in_stack_ffffffffffffffa8
       );
  delete_script(in_EDI,uVar2);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,iVar6,iVar3,pc,in_stack_ffffffffffffffa8
       );
  callback_cancel(uVar1);
  return;
}

Assistant:

void t9(int pi)
{
   int s, oc, c, e, id;
   uint32_t p[10];

   printf("Script store/run/status/stop/delete tests.\n");

   gpio_write(pi, GPIO, 0); /* need known state */

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   id = callback(pi, GPIO, RISING_EDGE, t9cbf);

   s = store_script(pi, script);

   /* Wait for script to finish initing. */
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_RUNNING) break;
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1600) stop_script(pi, s);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 410, 10, "run/stop script/script status");

   e = delete_script(pi, s);
   CHECK(9, 4, e, 0, 0, "delete script");

   callback_cancel(id);
}